

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.h
# Opt level: O0

bool __thiscall
google::protobuf::compiler::cpp::FileGenerator::IsDepWeak(FileGenerator *this,FileDescriptor *dep)

{
  size_t sVar1;
  LogMessage *pLVar2;
  LogMessage local_38;
  Voidify local_21;
  FileDescriptor *local_20;
  FileDescriptor *dep_local;
  FileGenerator *this_local;
  
  local_20 = dep;
  dep_local = (FileDescriptor *)this;
  sVar1 = absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
          ::count<google::protobuf::FileDescriptor_const*>
                    ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
                      *)this,&local_20);
  if (sVar1 == 0) {
    this_local._7_1_ = false;
  }
  else {
    if (((this->options_).opensource_runtime & 1U) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_38,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/file.h"
                 ,0xa9,"!options_.opensource_runtime");
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar2);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_38);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool IsDepWeak(const FileDescriptor* dep) const {
    if (weak_deps_.count(dep) != 0) {
      ABSL_CHECK(!options_.opensource_runtime);
      return true;
    }
    return false;
  }